

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarPackedStruct::set_is_packed(VarPackedStruct *this,bool value)

{
  UserException *this_00;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  VarPackedStruct *pVStack_10;
  bool value_local;
  VarPackedStruct *this_local;
  
  if (!value) {
    local_11 = value;
    pVStack_10 = this;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unable to set packed struct unpacked",&local_39);
    UserException::UserException(this_00,&local_38);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

void VarPackedStruct::set_is_packed(bool value) {
    if (!value) throw UserException("Unable to set packed struct unpacked");
}